

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O0

bool __thiscall SWDParser::IsLineReset(SWDParser *this,SWDLineReset *reset)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  SWDBit local_a0;
  undefined1 local_78 [8];
  SWDBit bit;
  ulong local_28;
  size_t cnt;
  SWDLineReset *reset_local;
  SWDParser *this_local;
  
  SWDLineReset::Clear(reset);
  local_28 = 0;
  while( true ) {
    if (0x31 < local_28) {
      while( true ) {
        ParseBit(&local_a0,this);
        memcpy(local_78,&local_a0,0x28);
        bVar1 = SWDBit::IsHigh((SWDBit *)local_78,true);
        if (!bVar1) break;
        std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back
                  (&this->mBitsBuffer,(value_type *)local_78);
      }
      std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=(&reset->bits,&this->mBitsBuffer);
      std::vector<SWDBit,_std::allocator<SWDBit>_>::clear(&this->mBitsBuffer);
      std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back
                (&this->mBitsBuffer,(value_type *)local_78);
      return true;
    }
    sVar2 = std::vector<SWDBit,_std::allocator<SWDBit>_>::size(&this->mBitsBuffer);
    if (sVar2 <= local_28) {
      ParseBit((SWDBit *)&bit.low_end,this);
      std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back
                (&this->mBitsBuffer,(value_type *)&bit.low_end);
    }
    this_00 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,local_28);
    bVar1 = SWDBit::IsHigh(this_00,true);
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool SWDParser::IsLineReset( SWDLineReset& reset )
{
    reset.Clear();

    // we need at least 50 bits with a value of 1
    for( size_t cnt = 0; cnt < 50; cnt++ )
    {
        if( cnt >= mBitsBuffer.size() )
            mBitsBuffer.push_back( ParseBit() );

        // we can't have a low bit
        if( !mBitsBuffer[ cnt ].IsHigh() )
            return false;
    }

    SWDBit bit;
    while( true )
    {
        bit = ParseBit();
        if( !bit.IsHigh() )
            break;

        mBitsBuffer.push_back( bit );
    }

    // give the bits to the reset object
    reset.bits = mBitsBuffer;
    mBitsBuffer.clear();

    // keep the high bit because that one is probably next operation's start bit
    mBitsBuffer.push_back( bit );

    return true;
}